

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::probeUnitBase_abi_cxx11_
                   (precise_unit *un,pair<units::precise_unit,_const_char_*> *probe)

{
  double dVar1;
  bool bVar2;
  undefined1 uVar3;
  reference pvVar4;
  string *psVar5;
  unit index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  size_type sVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  precise_unit pVar9;
  string *in_stack_00000020;
  double in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_3;
  double mx;
  size_t cut;
  string prefix_3;
  string prefix_2;
  string prefix_1;
  string prefix;
  string fnd;
  unit base;
  precise_unit ext;
  string beststr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  char in_stack_fffffffffffffc07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  precise_unit *in_stack_fffffffffffffc10;
  precise_unit *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  unit in_stack_fffffffffffffc38;
  unit un_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_359 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  double local_278;
  undefined8 local_270;
  unit local_228;
  byte local_1d9;
  undefined1 in_stack_fffffffffffffe37;
  double in_stack_fffffffffffffe38;
  unit_data local_16c;
  unit local_168;
  unit local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_158;
  allocator<char> local_14a;
  byte local_149;
  unit local_128;
  int local_fc;
  byte local_d1;
  unit local_90;
  unit_data local_64;
  unit local_60 [3];
  undefined1 local_48 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00));
  pVar9 = precise_unit::operator*
                    (in_stack_fffffffffffffc10,(precise_unit *)in_stack_fffffffffffffc08);
  local_48._8_8_ = pVar9._8_8_;
  local_48._0_8_ = pVar9.multiplier_;
  local_64 = precise_unit::base_units((precise_unit *)local_48);
  unit::unit(local_60,&local_64);
  local_90 = local_60[0];
  find_unit_abi_cxx11_(in_stack_fffffffffffffc38);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799338);
  if (!bVar2) {
    precise_unit::multiplier((precise_unit *)local_48);
    std::__cxx11::string::string(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    generateUnitSequence(in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    local_d1 = 0;
    std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc07);
    std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffbf0);
    bVar2 = isNumericalStartCharacter(*pvVar4);
    if (bVar2) {
      bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7994ff);
      if (bVar2) {
LAB_00799535:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      }
      else {
        in_stack_fffffffffffffc68 =
             (string *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(in_RDI);
        psVar5 = (string *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(&local_38);
        if (in_stack_fffffffffffffc68 < psVar5) goto LAB_00799535;
      }
      local_fc = 0;
    }
    else {
      local_d1 = 1;
      local_fc = 1;
    }
    if ((local_d1 & 1) == 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    if (local_fc != 0) goto LAB_0079a02c;
  }
  index = unit::inv((unit *)in_stack_fffffffffffffbf8);
  local_128 = index;
  find_unit_abi_cxx11_(in_stack_fffffffffffffc38);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffc40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc38);
  std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799609);
  if (!bVar2) {
    precise_unit::multiplier((precise_unit *)local_48);
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back(in_stack_fffffffffffffbf0);
    isDigitCharacter(*pvVar4);
    getMultiplierString_abi_cxx11_(in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37);
    local_149 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
    std::allocator<char>::~allocator(&local_14a);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (char)((ulong)in_stack_fffffffffffffbf8 >> 0x38));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (char *)in_stack_fffffffffffffbf8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (char)((ulong)in_stack_fffffffffffffbf8 >> 0x38));
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799720);
    if (bVar2) {
LAB_00799749:
      local_149 = 1;
      local_fc = 1;
    }
    else {
      pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front(in_stack_fffffffffffffbf0);
      bVar2 = isNumericalStartCharacter(*pvVar4);
      if (!bVar2) goto LAB_00799749;
      bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7997ba);
      if (bVar2) {
LAB_007997ea:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffc40,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffffc38);
      }
      else {
        in_stack_fffffffffffffc40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(in_RDI);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(&local_38);
        if (in_stack_fffffffffffffc40 < pbVar6) goto LAB_007997ea;
      }
      local_fc = 0;
    }
    if ((local_149 & 1) == 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    if (local_fc != 0) goto LAB_0079a02c;
  }
  pVar9 = precise_unit::operator/
                    ((precise_unit *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                     in_stack_fffffffffffffc18);
  pbVar6 = pVar9._8_8_;
  un_00 = (unit)pVar9.multiplier_;
  local_160 = un_00;
  pbStack_158 = pbVar6;
  local_48._0_8_ = un_00;
  local_48._8_8_ = pbVar6;
  local_16c = precise_unit::base_units((precise_unit *)local_48);
  unit::unit(&local_168,&local_16c);
  local_60[0] = local_168;
  find_unit_abi_cxx11_(un_00);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffc40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)un_00);
  std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799932);
  if (!bVar2) {
    in_stack_fffffffffffffc28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         precise_unit::multiplier((precise_unit *)local_48);
    std::__cxx11::string::string(pbVar6,in_stack_fffffffffffffc28);
    generateUnitSequence(in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    local_1d9 = 0;
    std::operator+(in_stack_fffffffffffffc08,in_stack_fffffffffffffc07);
    std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffbf0);
    in_stack_fffffffffffffc27 = isNumericalStartCharacter(*pvVar4);
    if ((bool)in_stack_fffffffffffffc27) {
      bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799abb);
      if (bVar2) {
LAB_00799aeb:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      }
      else {
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(in_RDI);
        sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_38);
        if (sVar7 < sVar8) goto LAB_00799aeb;
      }
      local_fc = 0;
    }
    else {
      local_1d9 = 1;
      local_fc = 1;
    }
    if ((local_1d9 & 1) == 0) {
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    if (local_fc != 0) goto LAB_0079a02c;
  }
  local_228 = unit::inv((unit *)in_stack_fffffffffffffbf8);
  find_unit_abi_cxx11_(un_00);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffc40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)un_00);
  std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799bbf);
  if (!bVar2) {
    dVar1 = precise_unit::multiplier((precise_unit *)local_48);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(1.0 / dVar1);
    std::__cxx11::string::string(pbVar6,in_stack_fffffffffffffc28);
    generateUnitSequence(in_stack_00000028,in_stack_00000020);
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffbf0);
    uVar3 = isNumericalStartCharacter(*pvVar4);
    if ((bool)uVar3) {
      local_270 = 0;
      local_278 = getDoubleFromString(in_stack_fffffffffffffc68,(size_t *)index);
      getMultiplierString_abi_cxx11_(in_stack_fffffffffffffe38,(bool)in_stack_fffffffffffffe37);
      std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
      std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (this,CONCAT17(uVar3,in_stack_fffffffffffffc00),(size_type)in_stack_fffffffffffffbf8
                );
      std::operator+(in_stack_fffffffffffffc28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x799d6c);
      if (bVar2) {
LAB_00799da0:
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      }
      else {
        sVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_298);
        sVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_38);
        if (sVar7 < sVar8) goto LAB_00799da0;
      }
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      local_fc = 0;
    }
    else {
      in_stack_fffffffffffffbf0 = local_359;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (pbVar6,(char *)in_stack_fffffffffffffc28,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      std::operator+(in_stack_fffffffffffffbf8,(char *)in_stack_fffffffffffffbf0);
      std::operator+(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
      std::allocator<char>::~allocator((allocator<char> *)local_359);
      local_fc = 1;
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
    if (local_fc != 0) goto LAB_0079a02c;
  }
  std::__cxx11::string::string(pbVar6,in_stack_fffffffffffffc28);
  local_fc = 1;
LAB_0079a02c:
  std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
  std::__cxx11::string::~string(in_stack_fffffffffffffbf0);
  return (string *)in_RDI;
}

Assistant:

static std::string probeUnitBase(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    std::string beststr;
    // let's try common divisor units on base units
    auto ext = un * probe.first;
    auto base = unit(ext.base_units());
    auto fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);

        auto str = prefix + '/' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try inverse of common multiplier units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = getMultiplierString(
            1.0 / ext.multiplier(), isDigitCharacter(fnd.back()));
        std::string str{"1/("};
        str += prefix;
        str += fnd;
        str.push_back('*');
        str.append(probe.second);
        str.push_back(')');
        if (prefix.empty() || !isNumericalStartCharacter(prefix.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = std::move(str);
        }
    }
    // let's try common multiplier units on base units
    ext = un / probe.first;
    base = unit(ext.base_units());
    fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);
        auto str = prefix + '*' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try common divisor with inv units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(1.0 / ext.multiplier(), fnd);
        if (isNumericalStartCharacter(prefix.front())) {
            size_t cut{0};
            double mx = getDoubleFromString(prefix, &cut);

            auto str = getMultiplierString(1.0 / mx, true) + probe.second +
                "/" + prefix.substr(cut);
            if (beststr.empty() || str.size() < beststr.size()) {
                beststr = str;
            }

        } else {
            return std::string(probe.second) + "/" + prefix;
        }
    }
    return beststr;
}